

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O3

int xmlPatternCompileSafe
              (xmlChar *pattern,xmlDict *dict,int flags,xmlChar **namespaces,
              xmlPatternPtr *patternOut)

{
  _xmlPattern **pp_Var1;
  xmlPatOp xVar2;
  xmlStepOpPtr pxVar3;
  xmlDictPtr dict_00;
  xmlStreamStepPtr pxVar4;
  bool bVar5;
  xmlChar *pxVar6;
  xmlChar xVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  xmlPatParserContextPtr ctxt;
  xmlPatternPtr comp;
  xmlPatternPtr pxVar12;
  byte *pbVar13;
  xmlStreamCompPtr pxVar14;
  byte *pbVar15;
  xmlChar **ppxVar16;
  uint uVar17;
  xmlChar *pxVar18;
  ulong uVar19;
  long lVar20;
  _xmlPattern *p_Var21;
  xmlPatternPtr pxVar22;
  xmlChar *pxVar23;
  xmlChar **ppxVar24;
  uint flags_00;
  long lVar25;
  uint local_74;
  xmlChar *local_68;
  uint local_5c;
  
  if (patternOut == (xmlPatternPtr *)0x0) {
    return 1;
  }
  iVar9 = 0;
  if (pattern == (xmlChar *)0x0) {
    iVar9 = 1;
  }
  else {
    xVar7 = *pattern;
    if (xVar7 != '\0') {
      uVar17 = flags | 0x200;
      local_74 = 1;
      local_5c = 0;
      pxVar22 = (xmlPatternPtr)0x0;
LAB_00170dde:
      lVar20 = 0;
LAB_00170de0:
      pxVar12 = pxVar22;
      if (xVar7 != '\0') {
        if (xVar7 != '|') goto code_r0x00170df0;
        local_68 = xmlStrndup(pattern,(int)lVar20);
        iVar9 = -1;
        if (local_68 == (xmlChar *)0x0) goto LAB_001718f5;
        ctxt = (xmlPatParserContextPtr)(*xmlMalloc)(0x40);
        if (ctxt != (xmlPatParserContextPtr)0x0) {
          ctxt->error = 0;
          *(undefined4 *)&ctxt->field_0x14 = 0;
          ctxt->dict = (xmlDictPtr)0x0;
          ctxt->namespaces = (xmlChar **)0x0;
          ctxt->nb_namespaces = 0;
          *(undefined4 *)&ctxt->field_0x3c = 0;
          ctxt->comp = (xmlPatternPtr)0x0;
          ctxt->elem = (xmlNodePtr)0x0;
          ctxt->dict = dict;
          ctxt->cur = local_68;
          ctxt->base = local_68;
          if (namespaces != (xmlChar **)0x0) {
            iVar9 = -1;
            ppxVar16 = namespaces;
            do {
              iVar9 = iVar9 + 1;
              pxVar23 = *ppxVar16;
              ppxVar16 = ppxVar16 + 2;
            } while (pxVar23 != (xmlChar *)0x0);
            ctxt->nb_namespaces = iVar9;
          }
          ctxt->namespaces = namespaces;
          lVar20 = lVar20 + 1;
          goto LAB_00170ef1;
        }
        goto LAB_00171913;
      }
      ctxt = (xmlPatParserContextPtr)(*xmlMalloc)(0x40);
      if (ctxt != (xmlPatParserContextPtr)0x0) {
        ctxt->error = 0;
        *(undefined4 *)&ctxt->field_0x14 = 0;
        ctxt->dict = (xmlDictPtr)0x0;
        ctxt->namespaces = (xmlChar **)0x0;
        ctxt->nb_namespaces = 0;
        *(undefined4 *)&ctxt->field_0x3c = 0;
        ctxt->comp = (xmlPatternPtr)0x0;
        ctxt->elem = (xmlNodePtr)0x0;
        ctxt->dict = dict;
        ctxt->cur = pattern;
        ctxt->base = pattern;
        if (namespaces != (xmlChar **)0x0) {
          iVar9 = -1;
          ppxVar16 = namespaces;
          do {
            iVar9 = iVar9 + 1;
            pxVar23 = *ppxVar16;
            ppxVar16 = ppxVar16 + 2;
          } while (pxVar23 != (xmlChar *)0x0);
          ctxt->nb_namespaces = iVar9;
        }
        ctxt->namespaces = namespaces;
        local_68 = (xmlChar *)0x0;
LAB_00170ef1:
        pattern = pattern + lVar20;
        comp = (xmlPatternPtr)(*xmlMalloc)(0x40);
        if (comp != (xmlPatternPtr)0x0) {
          comp->steps = (xmlStepOpPtr)0x0;
          comp->stream = (xmlStreamCompPtr)0x0;
          comp->flags = 0;
          comp->nbStep = 0;
          comp->maxStep = 0;
          *(undefined4 *)&comp->field_0x2c = 0;
          comp->next = (_xmlPattern *)0x0;
          comp->pattern = (xmlChar *)0x0;
          comp->data = (void *)0x0;
          comp->dict = (xmlDictPtr)0x0;
          if (dict != (xmlDict *)0x0) {
            comp->dict = dict;
            xmlDictReference(dict);
          }
          pxVar12 = comp;
          if (pxVar22 != (xmlPatternPtr)0x0) {
            comp->next = pxVar22->next;
            pxVar22->next = comp;
            pxVar12 = pxVar22;
          }
          comp->flags = flags;
          ctxt->comp = comp;
          pbVar13 = ctxt->cur;
          pbVar15 = pbVar13;
          if ((flags & 6U) != 0) {
            while( true ) {
              pbVar15 = pbVar15 + 1;
              uVar19 = (ulong)*pbVar13;
              if (0x2f < uVar19) break;
              if ((0x100002600U >> (uVar19 & 0x3f) & 1) == 0) {
                if (uVar19 == 0x2f) goto LAB_0017143d;
                break;
              }
              pbVar13 = pbVar13 + 1;
              ctxt->cur = pbVar13;
            }
            comp->flags = uVar17;
            if (*pbVar13 != 0x2e) goto LAB_0017123c;
            while( true ) {
              ctxt->cur = pbVar15;
              uVar19 = (ulong)*pbVar15;
              if (0x2f < uVar19) break;
              if ((0x100002600U >> (uVar19 & 0x3f) & 1) == 0) {
                if (uVar19 == 0) {
                  iVar9 = xmlPatternAdd(ctxt,comp,XML_OP_ELEM,(xmlChar *)0x0,(xmlChar *)0x0);
                  if (iVar9 == 0) goto LAB_00171444;
                }
                else if (uVar19 == 0x2f) goto LAB_0017100e;
                break;
              }
              pbVar15 = pbVar15 + 1;
            }
            goto LAB_0017143d;
          }
          while( true ) {
            pbVar15 = pbVar13 + 1;
            bVar8 = *pbVar13;
            uVar19 = (ulong)bVar8;
            if (0x2f < uVar19) break;
            if ((0x100002600U >> (uVar19 & 0x3f) & 1) == 0) {
              uVar10 = uVar17;
              if ((uVar19 == 0x2e) || (uVar10 = flags | 0x100, uVar19 == 0x2f)) goto LAB_00171079;
              break;
            }
            ctxt->cur = pbVar15;
            pbVar13 = pbVar15;
          }
          uVar10 = uVar17;
          if ((flags & 1U) != 0) {
LAB_00171079:
            comp->flags = uVar10;
            bVar8 = *pbVar13;
          }
          if (bVar8 == 0x2e) {
            if ((*pbVar15 == 0x2f) && (pbVar13[2] == 0x2f)) {
              iVar9 = xmlPatternAdd(ctxt,comp,XML_OP_ANCESTOR,(xmlChar *)0x0,(xmlChar *)0x0);
              if (iVar9 == 0) {
                pbVar15 = ctxt->cur;
                pbVar13 = pbVar15;
                if (*pbVar15 == 0) goto LAB_001712ef;
                ctxt->cur = pbVar15 + 1;
                pbVar13 = pbVar15 + 1;
                if (pbVar15[1] == 0) goto LAB_001712ef;
                ctxt->cur = pbVar15 + 2;
                pbVar13 = pbVar15 + 2;
                if (pbVar15[2] == 0) goto LAB_001712ef;
                pbVar13 = pbVar15 + 3;
                while( true ) {
                  ctxt->cur = pbVar13;
LAB_001712ef:
                  bVar8 = *pbVar13;
                  uVar19 = (ulong)bVar8;
                  if (0x20 < uVar19) goto LAB_00171155;
                  if ((0x100002600U >> (uVar19 & 0x3f) & 1) == 0) break;
                  pbVar13 = pbVar13 + 1;
                }
                if (uVar19 == 0) goto LAB_0017143d;
                goto LAB_00171155;
              }
              goto LAB_00171444;
            }
LAB_0017133a:
            xmlCompileStepPattern(ctxt);
            if (ctxt->error != 0) goto LAB_00171444;
            pbVar13 = ctxt->cur;
            while( true ) {
              bVar8 = *pbVar13;
              uVar19 = (ulong)bVar8;
              if (0x2f < uVar19) break;
              if ((0x100002600U >> (uVar19 & 0x3f) & 1) == 0) {
                if (uVar19 == 0x2f) goto LAB_0017137a;
                break;
              }
              pbVar13 = pbVar13 + 1;
              ctxt->cur = pbVar13;
            }
            goto LAB_00171435;
          }
          if (bVar8 != 0x2f) {
LAB_00171155:
            if (bVar8 != 0x40) {
              if (bVar8 != 0x2f) goto LAB_0017133a;
              pxVar22 = ctxt->comp;
              goto LAB_0017116a;
            }
            ctxt->cur = pbVar13 + 1;
            xmlCompileAttributeTest(ctxt);
            if (ctxt->error != 0) goto LAB_00171444;
            pbVar13 = ctxt->cur;
            while( true ) {
              uVar19 = (ulong)*pbVar13;
              if (0x20 < uVar19) break;
              if ((0x100002600U >> (uVar19 & 0x3f) & 1) == 0) {
                if (uVar19 == 0) goto LAB_00171444;
                break;
              }
              ctxt->cur = pbVar13 + 1;
              pbVar13 = pbVar13 + 1;
            }
            xmlCompileStepPattern(ctxt);
            if (ctxt->error != 0) goto LAB_00171444;
            bVar8 = *ctxt->cur;
            goto LAB_00171435;
          }
          pxVar22 = comp;
          if (*pbVar15 == 0x2f) {
            iVar9 = xmlPatternAdd(ctxt,comp,XML_OP_ANCESTOR,(xmlChar *)0x0,(xmlChar *)0x0);
            if (iVar9 != 0) goto LAB_00171444;
            pxVar23 = ctxt->cur;
            if ((*pxVar23 == '\0') || (ctxt->cur = pxVar23 + 1, pxVar23[1] == '\0'))
            goto LAB_0017133a;
            pbVar13 = pxVar23 + 2;
            ctxt->cur = pbVar13;
            bVar8 = pxVar23[2];
            goto LAB_00171155;
          }
LAB_0017116a:
          iVar9 = xmlPatternAdd(ctxt,pxVar22,XML_OP_ROOT,(xmlChar *)0x0,(xmlChar *)0x0);
          if (iVar9 == 0) {
            pbVar13 = ctxt->cur;
            if (*pbVar13 != 0) goto LAB_00171328;
            while (uVar19 = (ulong)*pbVar13, uVar19 < 0x21) {
              if ((0x100002600U >> (uVar19 & 0x3f) & 1) == 0) {
                if (uVar19 == 0) goto LAB_0017143d;
                break;
              }
LAB_00171328:
              pbVar13 = pbVar13 + 1;
              ctxt->cur = pbVar13;
            }
            goto LAB_0017133a;
          }
          goto LAB_00171444;
        }
        iVar9 = -1;
        goto LAB_0017188c;
      }
LAB_001718f5:
      iVar9 = -1;
      local_68 = (xmlChar *)0x0;
      goto LAB_00171913;
    }
  }
LAB_00171937:
  pxVar12 = (xmlPatternPtr)0x0;
LAB_0017193a:
  *patternOut = pxVar12;
  return iVar9;
code_r0x00170df0:
  xVar7 = pattern[lVar20 + 1];
  lVar20 = lVar20 + 1;
  goto LAB_00170de0;
  while ((0x100002600U >> (uVar19 & 0x3f) & 1) != 0) {
LAB_0017100e:
    pbVar13 = pbVar15;
    pbVar15 = pbVar13 + 1;
    ctxt->cur = pbVar15;
    bVar8 = *pbVar15;
    uVar19 = (ulong)bVar8;
    if (0x2f < uVar19) goto LAB_00171234;
  }
  if (uVar19 == 0x2f) {
    uVar19 = (ulong)*pbVar13;
    if (((uVar19 < 0x21) && ((0x100002600U >> (uVar19 & 0x3f) & 1) != 0)) ||
       (iVar9 = xmlPatternAdd(ctxt,comp,XML_OP_ANCESTOR,(xmlChar *)0x0,(xmlChar *)0x0), iVar9 != 0))
    goto LAB_0017143d;
    pbVar13 = ctxt->cur;
    if (*pbVar13 != 0) goto LAB_0017122b;
    while( true ) {
      bVar8 = *pbVar13;
      if ((0x20 < (ulong)bVar8) || ((0x100002600U >> ((ulong)bVar8 & 0x3f) & 1) == 0)) break;
LAB_0017122b:
      pbVar13 = pbVar13 + 1;
      ctxt->cur = pbVar13;
    }
  }
LAB_00171234:
  if (bVar8 != 0) {
LAB_0017123c:
    xmlCompileStepPattern(ctxt);
    if (ctxt->error == 0) {
      while( true ) {
        pbVar13 = ctxt->cur;
        while( true ) {
          uVar19 = (ulong)*pbVar13;
          if (0x2f < uVar19) goto LAB_0017143d;
          if ((0x100002600U >> (uVar19 & 0x3f) & 1) == 0) break;
          ctxt->cur = pbVar13 + 1;
          pbVar13 = pbVar13 + 1;
        }
        if (uVar19 == 0) goto LAB_00171444;
        if ((uVar19 != 0x2f) ||
           (iVar9 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_PARENT,(xmlChar *)0x0,(xmlChar *)0x0),
           iVar9 != 0)) break;
        pbVar13 = ctxt->cur;
        if (*pbVar13 != 0) goto LAB_001712bc;
        while (uVar19 = (ulong)*pbVar13, uVar19 < 0x30) {
          if ((0x100002600U >> (uVar19 & 0x3f) & 1) == 0) {
            if ((uVar19 == 0) || (uVar19 == 0x2f)) goto LAB_0017143d;
            break;
          }
LAB_001712bc:
          pbVar13 = pbVar13 + 1;
          ctxt->cur = pbVar13;
        }
        xmlCompileStepPattern(ctxt);
        if (ctxt->error != 0) break;
      }
    }
  }
LAB_0017143d:
  ctxt->error = 1;
  goto LAB_00171444;
LAB_0017137a:
  do {
    if (pbVar13[1] == 0x2f) {
      iVar9 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_ANCESTOR,(xmlChar *)0x0,(xmlChar *)0x0);
      if (iVar9 != 0) goto LAB_00171444;
      pbVar13 = ctxt->cur;
      pbVar15 = pbVar13;
      if (*pbVar13 == 0) goto LAB_00171400;
      ctxt->cur = pbVar13 + 1;
      pbVar15 = pbVar13 + 1;
      if (pbVar13[1] == 0) goto LAB_00171400;
      pbVar15 = pbVar13 + 2;
      while( true ) {
        ctxt->cur = pbVar15;
LAB_00171400:
        if ((0x20 < (ulong)*pbVar15) || ((0x100002600U >> ((ulong)*pbVar15 & 0x3f) & 1) == 0))
        break;
        pbVar15 = pbVar15 + 1;
      }
    }
    else {
      iVar9 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_PARENT,(xmlChar *)0x0,(xmlChar *)0x0);
      if (iVar9 != 0) goto LAB_00171444;
      pbVar13 = ctxt->cur;
      if (*pbVar13 != 0) goto LAB_001713f0;
      while (uVar19 = (ulong)*pbVar13, uVar19 < 0x21) {
        if ((0x100002600U >> (uVar19 & 0x3f) & 1) == 0) {
          if (uVar19 == 0) goto LAB_0017143d;
          break;
        }
LAB_001713f0:
        pbVar13 = pbVar13 + 1;
        ctxt->cur = pbVar13;
      }
    }
    xmlCompileStepPattern(ctxt);
    if (ctxt->error != 0) goto LAB_00171444;
    pbVar13 = ctxt->cur;
    bVar8 = *pbVar13;
  } while (bVar8 == 0x2f);
LAB_00171435:
  if (bVar8 != 0) goto LAB_0017143d;
LAB_00171444:
  iVar9 = ctxt->error;
  if (iVar9 != 0) {
LAB_0017188c:
    *(undefined4 *)&ctxt->namespaces = 0xffffffff;
    *(undefined4 *)((long)&ctxt->namespaces + 4) = 0xffffffff;
    ctxt->nb_namespaces = -1;
    *(undefined4 *)&ctxt->field_0x3c = 0xffffffff;
    *(undefined4 *)&ctxt->comp = 0xffffffff;
    *(undefined4 *)((long)&ctxt->comp + 4) = 0xffffffff;
    *(undefined4 *)&ctxt->elem = 0xffffffff;
    *(undefined4 *)((long)&ctxt->elem + 4) = 0xffffffff;
    ctxt->error = -1;
    *(undefined4 *)&ctxt->field_0x14 = 0xffffffff;
    *(undefined4 *)&ctxt->dict = 0xffffffff;
    *(undefined4 *)((long)&ctxt->dict + 4) = 0xffffffff;
    *(undefined4 *)&ctxt->cur = 0xffffffff;
    *(undefined4 *)((long)&ctxt->cur + 4) = 0xffffffff;
    *(undefined4 *)&ctxt->base = 0xffffffff;
    *(undefined4 *)((long)&ctxt->base + 4) = 0xffffffff;
    (*xmlFree)(ctxt);
    goto LAB_00171913;
  }
  *(undefined4 *)&ctxt->namespaces = 0xffffffff;
  *(undefined4 *)((long)&ctxt->namespaces + 4) = 0xffffffff;
  ctxt->nb_namespaces = -1;
  *(undefined4 *)&ctxt->field_0x3c = 0xffffffff;
  *(undefined4 *)&ctxt->comp = 0xffffffff;
  *(undefined4 *)((long)&ctxt->comp + 4) = 0xffffffff;
  *(undefined4 *)&ctxt->elem = 0xffffffff;
  *(undefined4 *)((long)&ctxt->elem + 4) = 0xffffffff;
  ctxt->error = -1;
  *(undefined4 *)&ctxt->field_0x14 = 0xffffffff;
  *(undefined4 *)&ctxt->dict = 0xffffffff;
  *(undefined4 *)((long)&ctxt->dict + 4) = 0xffffffff;
  *(undefined4 *)&ctxt->cur = 0xffffffff;
  *(undefined4 *)((long)&ctxt->cur + 4) = 0xffffffff;
  *(undefined4 *)&ctxt->base = 0xffffffff;
  *(undefined4 *)((long)&ctxt->base + 4) = 0xffffffff;
  (*xmlFree)(ctxt);
  if (local_74 == 0) {
    local_74 = 0;
LAB_00171718:
    uVar10 = comp->nbStep;
    if ((0 < (int)uVar10) && (comp->steps->op == XML_OP_ANCESTOR)) {
      uVar11 = 0;
      if (uVar10 != 1) {
        uVar19 = (ulong)(uVar10 - 1);
        ppxVar16 = &comp->steps[1].value;
        do {
          ppxVar16[-3] = *ppxVar16;
          ppxVar16[-2] = ppxVar16[1];
          *(xmlPatOp *)(ppxVar16 + -4) = ((xmlStepOp *)(ppxVar16 + -1))->op;
          ppxVar16 = ppxVar16 + 3;
          uVar19 = uVar19 - 1;
          uVar11 = uVar10 - 1;
        } while (uVar19 != 0);
      }
      uVar10 = uVar11;
      comp->nbStep = uVar10;
    }
    if ((int)uVar10 < comp->maxStep) {
LAB_0017176f:
      pxVar3 = comp->steps;
      if ((int)uVar10 < 2) {
        uVar19 = (ulong)(int)uVar10;
      }
      else {
        uVar19 = (ulong)uVar10;
        ppxVar16 = &pxVar3->value;
        ppxVar24 = &pxVar3[uVar19 - 1].value;
        lVar25 = 0;
        lVar20 = uVar19 - 2;
        do {
          pxVar23 = *ppxVar16;
          pxVar18 = ppxVar16[1];
          pxVar6 = ppxVar24[1];
          *ppxVar16 = *ppxVar24;
          ppxVar16[1] = pxVar6;
          *ppxVar24 = pxVar23;
          ppxVar24[1] = pxVar18;
          xVar2 = ((xmlStepOp *)(ppxVar16 + -1))->op;
          ((xmlStepOp *)(ppxVar16 + -1))->op = ((xmlStepOp *)(ppxVar24 + -1))->op;
          ((xmlStepOp *)(ppxVar24 + -1))->op = xVar2;
          lVar25 = lVar25 + 1;
          ppxVar16 = ppxVar16 + 3;
          ppxVar24 = ppxVar24 + -3;
          bVar5 = lVar25 < lVar20;
          lVar20 = lVar20 + -1;
        } while (bVar5);
      }
      pxVar3[uVar19].value = (xmlChar *)0x0;
      pxVar3[uVar19].value2 = (xmlChar *)0x0;
      comp->nbStep = uVar10 + 1;
      pxVar3[uVar19].op = XML_OP_END;
      if (local_68 != (xmlChar *)0x0) {
        (*xmlFree)(local_68);
      }
      xVar7 = *pattern;
      pxVar22 = pxVar12;
      if (xVar7 == '\0') goto LAB_001718b2;
      goto LAB_00170dde;
    }
    iVar9 = xmlPatternGrow(comp);
    if (-1 < iVar9) {
      uVar10 = comp->nbStep;
      goto LAB_0017176f;
    }
  }
  else {
    if (local_5c == 0x200) {
      uVar10 = (uint)comp->flags >> 8 & 1;
      local_5c = 0x200;
      local_74 = uVar10;
LAB_001714f6:
      local_74 = local_74 ^ 1;
      if (uVar10 != 0) goto LAB_00171718;
    }
    else {
      if (local_5c == 0x100) {
        uVar10 = comp->flags & 0x200;
        local_5c = 0x100;
        local_74 = uVar10 >> 9;
        goto LAB_001714f6;
      }
      local_74 = 1;
      if (local_5c == 0) {
        local_5c = comp->flags & 0x300;
      }
    }
    pxVar3 = comp->steps;
    if (pxVar3 != (xmlStepOpPtr)0x0) {
      if ((((comp->nbStep == 1) && (pxVar3->op == XML_OP_ELEM)) && (pxVar3->value == (xmlChar *)0x0)
          ) && (pxVar3->value2 == (xmlChar *)0x0)) {
        pxVar14 = xmlNewStreamComp(0);
        if (pxVar14 != (xmlStreamCompPtr)0x0) {
          pbVar13 = (byte *)((long)&pxVar14->flags + 1);
          *pbVar13 = *pbVar13 | 0x40;
          comp->stream = pxVar14;
          goto LAB_00171718;
        }
      }
      else {
        pxVar14 = xmlNewStreamComp(comp->nbStep / 2 + 1);
        if (pxVar14 != (xmlStreamCompPtr)0x0) {
          dict_00 = comp->dict;
          if (dict_00 != (xmlDictPtr)0x0) {
            pxVar14->dict = dict_00;
            xmlDictReference(dict_00);
          }
          uVar10 = comp->flags;
          if ((uVar10 >> 8 & 1) != 0) {
            pbVar13 = (byte *)((long)&pxVar14->flags + 1);
            *pbVar13 = *pbVar13 | 0x80;
          }
          uVar19 = (ulong)(uint)comp->nbStep;
          if (comp->nbStep < 1) {
            uVar11 = 0;
LAB_001716e0:
            bVar5 = true;
            if ((uVar10 & 7) == 0) {
              if (((uint)pxVar14->flags >> 0x10 & 1) == 0) {
                pxVar14->flags = pxVar14->flags | 0x10000;
              }
              if (0 < pxVar14->nbStep) {
                uVar10 = pxVar14->steps->flags;
                if ((uVar10 & 1) == 0) {
                  pxVar14->steps->flags = uVar10 | 1;
                }
              }
            }
          }
          else {
            uVar10 = 0xffffffff;
            lVar20 = 0;
            uVar11 = 0;
            flags_00 = 0;
            bVar5 = false;
            do {
              pxVar3 = comp->steps;
              while( true ) {
                if (pxVar3[lVar20].op != XML_OP_ROOT) break;
                if (lVar20 != 0) goto LAB_0017170b;
                bVar5 = true;
                lVar20 = 1;
                if ((int)uVar19 < 2) goto LAB_001716da;
              }
              switch(pxVar3[lVar20].op) {
              case XML_OP_ELEM:
                pxVar23 = pxVar3[lVar20].value;
                pxVar18 = pxVar3[lVar20].value2;
                if (pxVar23 != (xmlChar *)0x0 || pxVar18 != (xmlChar *)0x0) goto LAB_001716ad;
                if (flags_00 != 0 && lVar20 + 1U == (uVar19 & 0xffffffff)) {
                  pbVar13 = (byte *)((long)&pxVar14->flags + 1);
                  *pbVar13 = *pbVar13 | 0x40;
                  uVar11 = xmlStreamCompAddStep
                                     (pxVar14,(xmlChar *)0x0,(xmlChar *)0x0,100,flags_00 | 0x10);
                  if ((int)uVar11 < 0) goto LAB_0017170b;
                  flags_00 = 0;
                  if (uVar10 != 0xffffffff) {
                    pxVar14->steps[uVar10].flags = pxVar14->steps[uVar10].flags | 0x20;
                  }
                  uVar10 = 0xffffffff;
                }
                break;
              case XML_OP_CHILD:
                pxVar23 = pxVar3[lVar20].value;
                pxVar18 = pxVar3[lVar20].value2;
                goto LAB_001716ad;
              case XML_OP_ATTR:
                uVar11 = xmlStreamCompAddStep
                                   (pxVar14,pxVar3[lVar20].value,pxVar3[lVar20].value2,2,
                                    flags_00 | 8);
                if (-1 < (int)uVar11) {
                  uVar10 = 0xffffffff;
                  goto LAB_001716be;
                }
                goto LAB_0017170b;
              case XML_OP_ANCESTOR:
                if (flags_00 == 0) {
                  flags_00 = 1;
                  if (((uint)pxVar14->flags >> 0x10 & 1) == 0) {
                    pxVar14->flags = pxVar14->flags | 0x10000;
                  }
                }
                break;
              case XML_OP_NS:
                pxVar18 = pxVar3[lVar20].value;
                pxVar23 = (xmlChar *)0x0;
                goto LAB_001716ad;
              case XML_OP_ALL:
                pxVar23 = (xmlChar *)0x0;
                pxVar18 = (xmlChar *)0x0;
LAB_001716ad:
                uVar11 = xmlStreamCompAddStep(pxVar14,pxVar23,pxVar18,1,flags_00);
                uVar10 = uVar11;
                if ((int)uVar11 < 0) goto LAB_0017170b;
LAB_001716be:
                flags_00 = 0;
              }
              lVar20 = lVar20 + 1;
              uVar19 = (ulong)comp->nbStep;
            } while (lVar20 < (long)uVar19);
            if (!bVar5) {
              uVar10 = comp->flags;
              goto LAB_001716e0;
            }
LAB_001716da:
            bVar5 = false;
          }
          if ((int)uVar11 < pxVar14->nbStep) {
            pxVar4 = pxVar14->steps;
            pxVar4[uVar11].flags = pxVar4[uVar11].flags | 2;
            if (!bVar5) {
              *(byte *)&pxVar4->flags = (byte)pxVar4->flags | 4;
            }
            comp->stream = pxVar14;
          }
          else {
LAB_0017170b:
            xmlFreeStreamComp(pxVar14);
          }
          goto LAB_00171718;
        }
      }
    }
  }
  iVar9 = -1;
LAB_00171913:
  if (pxVar12 != (xmlPatternPtr)0x0) {
    xmlFreePatternList(pxVar12);
  }
  if (local_68 != (xmlChar *)0x0) {
    (*xmlFree)(local_68);
  }
  goto LAB_00171937;
LAB_001718b2:
  iVar9 = 0;
  p_Var21 = pxVar12;
  if (pxVar12 != (xmlPatternPtr)0x0 && (char)local_74 == '\0') {
    do {
      if (p_Var21->stream != (xmlStreamCompPtr)0x0) {
        xmlFreeStreamComp(p_Var21->stream);
        p_Var21->stream = (xmlStreamCompPtr)0x0;
      }
      pp_Var1 = &p_Var21->next;
      p_Var21 = *pp_Var1;
    } while (*pp_Var1 != (_xmlPattern *)0x0);
  }
  goto LAB_0017193a;
}

Assistant:

int
xmlPatternCompileSafe(const xmlChar *pattern, xmlDict *dict, int flags,
                      const xmlChar **namespaces, xmlPatternPtr *patternOut) {
    xmlPatternPtr ret = NULL, cur;
    xmlPatParserContextPtr ctxt = NULL;
    const xmlChar *or, *start;
    xmlChar *tmp = NULL;
    int type = 0;
    int streamable = 1;
    int error;

    if (patternOut == NULL)
        return(1);

    if (pattern == NULL) {
        error = 1;
        goto error;
    }

    start = pattern;
    or = start;
    while (*or != 0) {
	tmp = NULL;
	while ((*or != 0) && (*or != '|')) or++;
        if (*or == 0)
	    ctxt = xmlNewPatParserContext(start, dict, namespaces);
	else {
	    tmp = xmlStrndup(start, or - start);
	    if (tmp != NULL) {
		ctxt = xmlNewPatParserContext(tmp, dict, namespaces);
	    }
	    or++;
	}
	if (ctxt == NULL) {
            error = -1;
            goto error;
        }
	cur = xmlNewPattern();
	if (cur == NULL) {
            error = -1;
            goto error;
        }
	/*
	* Assign string dict.
	*/
	if (dict) {
	    cur->dict = dict;
	    xmlDictReference(dict);
	}
	if (ret == NULL)
	    ret = cur;
	else {
	    cur->next = ret->next;
	    ret->next = cur;
	}
	cur->flags = flags;
	ctxt->comp = cur;

	if (XML_STREAM_XS_IDC(cur))
	    xmlCompileIDCXPathPath(ctxt);
	else
	    xmlCompilePathPattern(ctxt);
	if (ctxt->error != 0) {
            error = ctxt->error;
	    goto error;
        }
	xmlFreePatParserContext(ctxt);
	ctxt = NULL;


        if (streamable) {
	    if (type == 0) {
	        type = cur->flags & (PAT_FROM_ROOT | PAT_FROM_CUR);
	    } else if (type == PAT_FROM_ROOT) {
	        if (cur->flags & PAT_FROM_CUR)
		    streamable = 0;
	    } else if (type == PAT_FROM_CUR) {
	        if (cur->flags & PAT_FROM_ROOT)
		    streamable = 0;
	    }
	}
	if (streamable) {
	    error = xmlStreamCompile(cur);
            if (error != 0)
                goto error;
        }
	error = xmlReversePattern(cur);
        if (error != 0)
	    goto error;
	if (tmp != NULL) {
	    xmlFree(tmp);
	    tmp = NULL;
	}
	start = or;
    }
    if (streamable == 0) {
        cur = ret;
	while (cur != NULL) {
	    if (cur->stream != NULL) {
		xmlFreeStreamComp(cur->stream);
		cur->stream = NULL;
	    }
	    cur = cur->next;
	}
    }

    *patternOut = ret;
    return(0);
error:
    if (ctxt != NULL) xmlFreePatParserContext(ctxt);
    if (ret != NULL) xmlFreePattern(ret);
    if (tmp != NULL) xmlFree(tmp);
    *patternOut = NULL;
    return(error);
}